

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall ComponentManager::UnloadLibrary(ComponentManager *this,CID cid)

{
  ModuleInfo *this_00;
  bool bVar1;
  Node *pNVar2;
  iterator i;
  iterator local_30;
  CID cid_local;
  
  pNVar2 = ((this->mModules).mHead)->next;
  cid_local.mId = cid.mId;
  while( true ) {
    if (pNVar2 == (this->mModules).mTail) {
      return kNoClass;
    }
    bVar1 = ModuleInfo::operator==(pNVar2->val,&cid_local);
    if (bVar1) break;
    pNVar2 = pNVar2->next;
  }
  this_00 = pNVar2->val;
  dlclose(this_00->mHandle);
  std::__cxx11::string::~string((string *)this_00);
  operator_delete(this_00,0x30);
  JetHead::list<ComponentManager::ModuleInfo_*>::iterator::erase(&local_30);
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::UnloadLibrary( CID cid )
{
	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin(); 
		 i != mModules.end(); ++i)
	{
		if (*(*i) == cid)
		{
			ModuleInfo *info = *i;
			dlclose( info->mHandle );
			delete info;
			i.erase();
			return kNoError;
		}
	}
	
	return kNoClass;	
}